

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::IsTraceEnabled(BackwardPass *this)

{
  Phase phase;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte local_21;
  byte local_11;
  BackwardPass *this_local;
  
  phase = this->tag;
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,phase,uVar2,uVar3);
  local_11 = 0;
  if (bVar1) {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,SimpleJitPhase,uVar2,uVar3);
    local_21 = 1;
    if (!bVar1) {
      bVar1 = Func::IsSimpleJit(this->func);
      local_21 = bVar1 ^ 0xff;
    }
    local_11 = local_21;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
BackwardPass::IsTraceEnabled() const
{
    return
        Js::Configuration::Global.flags.Trace.IsEnabled(tag, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()) &&
        (PHASE_TRACE(Js::SimpleJitPhase, func) || !func->IsSimpleJit());
}